

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O2

void __thiscall
InlineeFrameRecord::RestoreFrames
          (InlineeFrameRecord *this,FunctionBody *functionBody,InlinedFrameLayout *outerMostFrame,
          JavascriptCallStackLayout *callstack,bool boxValues)

{
  InlineeFrameRecord *this_00;
  InlineeFrameRecord *this_01;
  InlineeFrameRecord *pIVar1;
  int iVar2;
  int iVar3;
  
  this_00 = Reverse(this);
  iVar2 = 1;
  for (; this_01 = this_00, (*(uint *)&outerMostFrame->callInfo & 0xf) != 0;
      outerMostFrame =
           (InlinedFrameLayout *)
           (&outerMostFrame[1].callInfo + ((ulong)*(uint *)&outerMostFrame->callInfo & 0xf))) {
    iVar2 = iVar2 + 1;
  }
  for (; this_01 != (InlineeFrameRecord *)0x0; this_01 = this_01->parent) {
    if (this_01->inlineDepth == iVar2) goto LAB_0050ff68;
  }
LAB_0050ffcc:
  Reverse(this_00);
  return;
LAB_0050ff68:
  iVar3 = iVar2;
  if (this_01 == (InlineeFrameRecord *)0x0) {
    *(uint *)(&outerMostFrame[1].callInfo + (*(uint *)&outerMostFrame->callInfo & 0xf)) =
         *(uint *)(&outerMostFrame[1].callInfo + (*(uint *)&outerMostFrame->callInfo & 0xf)) &
         0xfffffff0;
  }
  else {
    if (this_01->argCount != 0) goto LAB_0050ff74;
    pIVar1 = this_01->parent;
    if (pIVar1 != (InlineeFrameRecord *)0x0) goto LAB_0050ffa3;
  }
  goto LAB_0050ffcc;
LAB_0050ff74:
  Restore(this_01,functionBody,outerMostFrame,callstack,boxValues);
  pIVar1 = this_01->parent;
  this_01 = (InlineeFrameRecord *)0x0;
  iVar2 = iVar3;
  if (pIVar1 != (InlineeFrameRecord *)0x0) {
LAB_0050ffa3:
    for (; this_01 = pIVar1, iVar2 = pIVar1->inlineDepth, pIVar1->inlineDepth != iVar3;
        iVar3 = iVar3 + 1) {
      outerMostFrame =
           (InlinedFrameLayout *)
           (&outerMostFrame[1].callInfo + (*(uint *)&outerMostFrame->callInfo & 0xf));
    }
  }
  goto LAB_0050ff68;
}

Assistant:

void InlineeFrameRecord::RestoreFrames(Js::FunctionBody* functionBody, InlinedFrameLayout* outerMostFrame, Js::JavascriptCallStackLayout* callstack, bool boxValues)
{
    InlineeFrameRecord* innerMostRecord = this;
    class AutoReverse
    {
    public:
        InlineeFrameRecord* record;
        AutoReverse(InlineeFrameRecord* record)
        {
            this->record = record->Reverse();
        }

        ~AutoReverse()
        {
            record->Reverse();
        }
    } autoReverse(innerMostRecord);

    InlineeFrameRecord* currentRecord = autoReverse.record;
    InlinedFrameLayout* currentFrame = outerMostFrame;

    int inlineDepth = 1;

    // Find an inlined frame that needs to be restored.
    while (currentFrame->callInfo.Count != 0)
    {
        inlineDepth++;
        currentFrame = currentFrame->Next();
    }
    // Align the inline depth of the record with the frame that needs to be restored
    while (currentRecord && currentRecord->inlineDepth != inlineDepth)
    {
        currentRecord = currentRecord->parent;
    }
    int currentDepth = inlineDepth;

    // Return if there is nothing to restore
    if (!currentRecord)
    {
        return;
    }

    // We have InlineeFrameRecords for optimized frames and parents (i.e. inlinees) of optimized frames
    // InlineeFrameRecords for unoptimized frames don't have values to restore and have argCount 0
    while (currentRecord && (currentRecord->argCount != 0 || currentRecord->parent))
    {
        // There is nothing to restore for unoptimized frames
        if (currentRecord->argCount != 0)
        {
            currentRecord->Restore(functionBody, currentFrame, callstack, boxValues);
        }
        currentRecord = currentRecord->parent;

        // Walk stack frames forward to the depth of the next record
        if (currentRecord)
        {
            while (currentDepth != currentRecord->inlineDepth)
            {
                currentFrame = currentFrame->Next();
                currentDepth++;
            }
        }
    }
    
    // If we don't have any more InlineeFrameRecords, the innermost inlinee was an optimized frame
    if (!currentRecord)
    {
        // We determine the innermost inlinee by frame->Next()->callInfo.Count == 0
        // Optimized frames don't have this set when entering inlinee in the JITed code, so we must do
        // this for them now
        currentFrame->Next()->callInfo.Count = 0;
    }
}